

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiscreteTwoBodyScattering.test.cpp
# Opt level: O2

string * invalidLANG_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          0          1          29228 6  5     \n          2          1                                            9228 6  5     \n 0.000000+0 1.000000-5          1          0          4          49228 6  5     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      9228 6  5     \n 0.000000+0 2.000000+7         12          0          6          39228 6  5     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string invalidLANG() {
  return
    " 0.000000+0 0.000000+0          0          0          1          29228 6  5     \n"
    "          2          1                                            9228 6  5     \n"
    " 0.000000+0 1.000000-5          1          0          4          49228 6  5     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      9228 6  5     \n"
    " 0.000000+0 2.000000+7         12          0          6          39228 6  5     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0 6.000000+09228 6  5     \n";
}